

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

string * compute_U_value(string *__return_storage_ptr__,string *user_password,EncryptionData *data)

{
  uchar *puVar1;
  uchar *okey;
  size_type *psVar2;
  string *extraout_RAX;
  string *psVar3;
  EncryptionData *in_RCX;
  size_t n;
  ulong uVar4;
  string k1;
  Digest digest;
  MD5 md5;
  size_type __dnew_1;
  size_type __dnew;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  MD5 local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type sStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  size_type local_20;
  
  if (data->R < 3) {
    QPDF::compute_encryption_key((string *)local_98,(QPDF *)user_password,(string *)data,in_RCX);
    local_68._M_local_buf[0] = '.';
    local_68._M_local_buf[1] = '.';
    local_68._M_local_buf[2] = '\0';
    local_68._M_local_buf[3] = 0xb6;
    local_68._M_local_buf[4] = 0xd0;
    local_68._M_local_buf[5] = 'h';
    local_68._M_local_buf[6] = '>';
    local_68._M_local_buf[7] = 0x80;
    local_68._M_local_buf[8] = '/';
    local_68._M_local_buf[9] = '\f';
    local_68._M_local_buf[10] = 0xa9;
    local_68._M_local_buf[0xb] = 0xfe;
    local_68._M_local_buf[0xc] = 'd';
    local_68._M_local_buf[0xd] = 'S';
    local_68._M_local_buf[0xe] = 'i';
    local_68._M_local_buf[0xf] = 'z';
    local_78._M_local_buf[0] = '(';
    local_78._M_local_buf[1] = 0xbf;
    local_78._M_local_buf[2] = 'N';
    local_78._M_local_buf[3] = '^';
    local_78._M_local_buf[4] = 'N';
    local_78._M_local_buf[5] = 'u';
    local_78._M_local_buf[6] = 0x8a;
    local_78._M_local_buf[7] = 'A';
    local_78._M_local_buf[8] = 'd';
    local_78._M_local_buf[9] = '\0';
    local_78._M_local_buf[10] = 'N';
    local_78._M_local_buf[0xb] = 'V';
    local_78._M_local_buf[0xc] = 0xff;
    local_78._M_local_buf[0xd] = 0xfa;
    local_78._M_local_buf[0xe] = '\x01';
    local_78._M_local_buf[0xf] = '\b';
    uVar4 = (ulong)data->Length_bytes;
    if ((long)uVar4 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(data->Length_bytes);
    }
    if ((ulong)local_98._8_8_ <= uVar4 && uVar4 - local_98._8_8_ != 0) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)local_98,local_98._8_8_,0,(char)(uVar4 - local_98._8_8_));
    }
    puVar1 = QUtil::unsigned_char_pointer(local_78._M_local_buf);
    okey = QUtil::unsigned_char_pointer((string *)local_98);
    iterate_rc4(puVar1,0x20,okey,data->Length_bytes,1,false);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x20;
    psVar2 = (size_type *)
             std::__cxx11::string::_M_create((ulong *)__return_storage_ptr__,(ulong)&local_48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_48;
    psVar2[2] = local_68._M_allocated_capacity;
    psVar2[3] = local_68._8_8_;
    *psVar2 = local_78._M_allocated_capacity;
    psVar2[1] = local_78._8_8_;
    __return_storage_ptr__->_M_string_length = (size_type)local_48;
    local_48->_M_local_buf[(long)(__return_storage_ptr__->_M_dataplus)._M_p] = '\0';
  }
  else {
    QPDF::compute_encryption_key((string *)local_98,(QPDF *)user_password,(string *)data,in_RCX);
    MD5::MD5(&local_58,(uchar *)user_password,n,(uchar *)in_RCX);
    sStack_40 = 0;
    local_38._M_local_buf[0] = '\0';
    local_48 = &local_38;
    pad_or_truncate_password_V4((string *)&local_78,(string *)&local_38);
    MD5::encodeDataIncrementally(&local_58,(char *)local_78._M_allocated_capacity,0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(local_38._M_allocated_capacity._1_7_,
                                        local_38._M_local_buf[0]) + 1);
    }
    MD5::encodeDataIncrementally
              (&local_58,(data->id1)._M_dataplus._M_p,(data->id1)._M_string_length);
    MD5::digest(&local_58,(uchar *)&local_78._M_allocated_capacity);
    uVar4 = (ulong)data->Length_bytes;
    if ((long)uVar4 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(data->Length_bytes);
    }
    if ((ulong)local_98._8_8_ <= uVar4 && uVar4 - local_98._8_8_ != 0) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)local_98,local_98._8_8_,0,(char)(uVar4 - local_98._8_8_));
    }
    puVar1 = QUtil::unsigned_char_pointer((string *)local_98);
    iterate_rc4((uchar *)&local_78._M_allocated_capacity,0x10,puVar1,data->Length_bytes,0x14,false);
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_78._M_allocated_capacity;
    sStack_40 = local_78._8_8_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_20 = 0x20;
    puVar1 = (uchar *)std::__cxx11::string::_M_create
                                ((ulong *)__return_storage_ptr__,(ulong)&local_20);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)puVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)puVar1 = local_48;
    *(size_type *)(puVar1 + 8) = sStack_40;
    puVar1[0x10] = '\x01';
    puVar1[0x11] = '\"';
    puVar1[0x12] = 'E';
    puVar1[0x13] = 'j';
    puVar1[0x14] = 0x91;
    puVar1[0x15] = 0xba;
    puVar1[0x16] = 0xe5;
    puVar1[0x17] = '\x13';
    puVar1[0x18] = 'B';
    puVar1[0x19] = 's';
    puVar1[0x1a] = 0xa6;
    puVar1[0x1b] = 0xdb;
    puVar1[0x1c] = '\x13';
    puVar1[0x1d] = 'L';
    puVar1[0x1e] = 0x87;
    puVar1[0x1f] = 0xc4;
    __return_storage_ptr__->_M_string_length = local_20;
    (__return_storage_ptr__->_M_dataplus)._M_p[local_20] = '\0';
    if (local_58.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  psVar3 = (string *)(local_98 + 0x10);
  if ((string *)local_98._0_8_ != psVar3) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string
compute_U_value(std::string const& user_password, QPDF::EncryptionData const& data)
{
    if (data.getR() >= 3) {
        return compute_U_value_R3(user_password, data);
    }

    return compute_U_value_R2(user_password, data);
}